

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O0

double __thiscall CEDate::GetTime(CEDate *this,double *utc_offset)

{
  long *in_RDI;
  double dVar1;
  double *unaff_retaddr;
  double mjd_offset;
  double *in_stack_ffffffffffffffe0;
  
  dVar1 = (double)(**(code **)(*in_RDI + 0x28))();
  floor(dVar1);
  CETime::UTC(in_stack_ffffffffffffffe0);
  dVar1 = CETime::TimeSec2Time(unaff_retaddr);
  return dVar1;
}

Assistant:

double CEDate::GetTime(const double& utc_offset) const
{
    double mjd_offset = MJD();
    mjd_offset -= std::floor(mjd_offset);
    mjd_offset += utc_offset/24.0;
    return CETime::TimeSec2Time( CETime::UTC( mjd_offset ) ) ;
}